

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

bfile_t * bf_create_w(char *filename)

{
  byte *pbVar1;
  FILE *pFVar2;
  bfile_t *pbVar3;
  size_t sVar4;
  char *__dest;
  
  pFVar2 = fopen(filename,"wb");
  if (pFVar2 == (FILE *)0x0) {
    pbVar3 = (bfile_t *)0x0;
  }
  else {
    pbVar3 = create_bfile_t(0x1000);
    pbVar3->file = (FILE *)pFVar2;
    sVar4 = strlen(filename);
    __dest = (char *)malloc(sVar4 + 1);
    pbVar3->filename = __dest;
    strcpy(__dest,filename);
    pbVar1 = (byte *)((long)&pbVar3->flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return pbVar3;
}

Assistant:

bfile_t *
bf_create_w(
    const char * filename )
{
    FILE * file;
    bfile_t * bfile;

    bfile = NULL;
    file = fopen( filename, "wb" );
    if ( file != NULL ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        bfile->flags |= BF_WRITABLE;
    }

    return bfile;
}